

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O0

int instruction_is_valid(m68k_info *info,uint word_check)

{
  uint uVar1;
  uint in_ESI;
  long in_RDI;
  instruction_struct *i;
  uint instruction;
  int local_4;
  
  uVar1 = *(uint *)(in_RDI + 0x24);
  if (((g_instruction_table[uVar1].word2_mask == 0) ||
      ((in_ESI & g_instruction_table[uVar1].word2_mask) == g_instruction_table[uVar1].word2_match))
     && (g_instruction_table[uVar1].instruction != d68000_invalid)) {
    local_4 = 1;
  }
  else {
    d68000_invalid((m68k_info *)0x39d38e);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int instruction_is_valid(m68k_info *info, const unsigned int word_check)
{
	const unsigned int instruction = info->ir;
	instruction_struct *i = &g_instruction_table[instruction];

	if ( (i->word2_mask && ((word_check & i->word2_mask) != i->word2_match)) ||
		(i->instruction == d68000_invalid) ) {
		d68000_invalid(info);
		return 0;
	}

	return 1;
}